

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O0

void irr::executeBlit_TextureCombineColor_32_to_24(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  u32 uVar10;
  byte *pbVar11;
  long in_RDI;
  u32 combo_1;
  u32 dst_x_1;
  u8 *writeTo_1;
  u32 dx_1;
  u32 dy_1;
  u32 combo;
  u32 dst_x;
  u8 *writeTo;
  u32 src_x;
  u32 dx;
  u32 src_y;
  u32 dy;
  float hscale;
  float wscale;
  u8 *dst;
  u32 *src;
  u32 h;
  u32 w;
  uint local_50;
  uint local_4c;
  uint local_34;
  uint local_2c;
  long local_20;
  long local_18;
  
  uVar6 = *(uint *)(in_RDI + 0x38);
  uVar7 = *(uint *)(in_RDI + 0x3c);
  local_18 = *(long *)(in_RDI + 0x28);
  local_20 = *(long *)(in_RDI + 0x30);
  if ((*(byte *)(in_RDI + 0x50) & 1) == 0) {
    for (local_4c = 0; local_4c != uVar7; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 != uVar6; local_50 = local_50 + 1) {
        pbVar11 = (byte *)(local_20 + (ulong)(local_50 * 3));
        bVar3 = *pbVar11;
        bVar4 = pbVar11[1];
        bVar5 = pbVar11[2];
        uVar10 = PixelMul32_2(*(u32 *)(local_18 + (ulong)local_50 * 4),*(u32 *)(in_RDI + 0x20));
        uVar10 = PixelCombine32((uint)bVar3 << 0x10 | 0xff000000 | (uint)bVar4 << 8 | (uint)bVar5,
                                uVar10);
        *pbVar11 = (byte)(uVar10 >> 0x10);
        pbVar11[1] = (byte)(uVar10 >> 8);
        pbVar11[2] = (byte)uVar10;
      }
      local_18 = local_18 + *(int *)(in_RDI + 0x48);
      local_20 = local_20 + (ulong)*(uint *)(in_RDI + 0x4c);
    }
  }
  else {
    fVar1 = *(float *)(in_RDI + 0x54);
    fVar2 = *(float *)(in_RDI + 0x58);
    for (local_2c = 0; local_2c < uVar7; local_2c = local_2c + 1) {
      lVar9 = *(long *)(in_RDI + 0x28);
      iVar8 = *(int *)(in_RDI + 0x48);
      for (local_34 = 0; local_34 < uVar6; local_34 = local_34 + 1) {
        pbVar11 = (byte *)(local_20 + (ulong)(local_34 * 3));
        bVar3 = *pbVar11;
        bVar4 = pbVar11[1];
        bVar5 = pbVar11[2];
        uVar10 = PixelMul32_2(*(u32 *)(lVar9 + (ulong)(uint)(iVar8 * (int)(long)((float)local_2c *
                                                                                fVar2)) +
                                      ((long)((float)local_34 * fVar1) & 0xffffffffU) * 4),
                              *(u32 *)(in_RDI + 0x20));
        uVar10 = PixelCombine32((uint)bVar3 << 0x10 | 0xff000000 | (uint)bVar4 << 8 | (uint)bVar5,
                                uVar10);
        *pbVar11 = (byte)(uVar10 >> 0x10);
        pbVar11[1] = (byte)(uVar10 >> 8);
        pbVar11[2] = (byte)uVar10;
      }
      local_20 = local_20 + (ulong)*(uint *)(in_RDI + 0x4c);
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCombineColor_32_to_24(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u32 *src = static_cast<const u32 *>(job->src);
	u8 *dst = static_cast<u8 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (u32 *)((u8 *)(job->src) + job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u32 src_x = src[(u32)(dx * wscale)];
				u8 *writeTo = &dst[dx * 3];
				const u32 dst_x = 0xFF000000 | writeTo[0] << 16 | writeTo[1] << 8 | writeTo[2];
				const u32 combo = PixelCombine32(dst_x, PixelMul32_2(src_x, job->argb));
				*writeTo++ = (combo >> 16) & 0xFF;
				*writeTo++ = (combo >> 8) & 0xFF;
				*writeTo++ = combo & 0xFF;
			}
			dst += job->dstPitch;
		}
	} else {
		for (u32 dy = 0; dy != h; ++dy) {
			for (u32 dx = 0; dx != w; ++dx) {
				u8 *writeTo = &dst[dx * 3];
				const u32 dst_x = 0xFF000000 | writeTo[0] << 16 | writeTo[1] << 8 | writeTo[2];
				const u32 combo = PixelCombine32(dst_x, PixelMul32_2(src[dx], job->argb));
				*writeTo++ = (combo >> 16) & 0xFF;
				*writeTo++ = (combo >> 8) & 0xFF;
				*writeTo++ = combo & 0xFF;
			}

			src = (u32 *)((u8 *)(src) + job->srcPitch);
			dst += job->dstPitch;
		}
	}
}